

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O0

mallinfo * dlmallinfo(void)

{
  mallinfo *in_RDI;
  
  internal_mallinfo(in_RDI,&_gm_);
  return in_RDI;
}

Assistant:

struct mallinfo dlmallinfo(void) {
  return internal_mallinfo(gm);
}